

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall PRED<UFPC>::PerformLabeling(PRED<UFPC> *this)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  Mat1b *pMVar8;
  Mat1i *pMVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int r_i;
  long lVar16;
  uint *puVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar5 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar5;
  local_98.width = (int)((ulong)uVar5 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar5 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar5 >> 0x20) + 1) / 2) * (((int)uVar5 + 1) / 2) + 1);
  puVar3 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar26 = *(int *)&pMVar8->field_0xc;
  iVar7 = *(int *)&pMVar8->field_0x8;
  lVar25 = *(long *)&pMVar8->field_0x10;
  lVar27 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar24 = 0xffffffffffffffff;
  while( true ) {
    lVar23 = (long)(int)uVar24;
    uVar24 = lVar23 + 1;
    if (iVar26 <= (int)uVar24) break;
    if (*(char *)(lVar25 + uVar24) != '\0') {
      puVar3[UFPC::length_] = UFPC::length_;
      uVar13 = UFPC::length_ + 1;
      *(uint *)(lVar27 + 4 + lVar23 * 4) = UFPC::length_;
      UFPC::length_ = uVar13;
      uVar24 = lVar23 + 2;
      while( true ) {
        if ((long)iVar26 <= (long)uVar24) goto LAB_00190d00;
        if (*(char *)(lVar25 + uVar24) == '\0') break;
        *(undefined4 *)(lVar27 + uVar24 * 4) = *(undefined4 *)(lVar27 + -4 + uVar24 * 4);
        uVar24 = uVar24 + 1;
      }
      uVar24 = uVar24 & 0xffffffff;
    }
  }
LAB_00190d00:
  iVar26 = iVar26 + -1;
  lVar23 = (long)iVar26;
  lVar25 = 1;
  lVar27 = 0;
  do {
    if (iVar7 <= lVar25) {
      uVar13 = UFPC::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
      pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar25 = 0; puVar3 = UFPC::P_, lVar25 < *(int *)&pMVar9->field_0x8; lVar25 = lVar25 + 1)
      {
        lVar27 = **(long **)&pMVar9->field_0x48 * lVar25 + *(long *)&pMVar9->field_0x10;
        iVar26 = *(int *)&pMVar9->field_0xc;
        for (lVar23 = 0; (long)iVar26 * 4 != lVar23; lVar23 = lVar23 + 4) {
          *(uint *)(lVar27 + lVar23) = puVar3[*(uint *)(lVar27 + lVar23)];
        }
      }
      UFPC::Dealloc();
      return;
    }
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar14 = *(long *)&pMVar8->field_0x10;
    lVar10 = **(long **)&pMVar8->field_0x48;
    lVar22 = lVar10 * lVar25;
    lVar2 = lVar14 + lVar22;
    pcVar19 = (char *)(lVar2 - lVar10);
    lVar11 = *(long *)&pMVar9->field_0x10;
    lVar12 = **(long **)&pMVar9->field_0x48;
    lVar16 = lVar12 * lVar25;
    puVar3 = (uint *)(lVar16 + lVar11);
    puVar17 = (uint *)((long)puVar3 - lVar12);
    if (iVar26 != 0) {
      if (*(char *)(lVar14 + lVar22) == '\0') {
        uVar24 = 0;
        goto LAB_00190e33;
      }
      if (*pcVar19 == '\0') {
        if (pcVar19[1] == '\0') {
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar13 = UFPC::length_ + 1;
          *puVar3 = UFPC::length_;
          UFPC::length_ = uVar13;
          lVar15 = 0;
          goto LAB_00191003;
        }
        *puVar3 = puVar17[1];
        iVar29 = 0;
        goto LAB_001910fe;
      }
      *puVar3 = *puVar17;
      uVar24 = 0;
LAB_00191132:
      iVar29 = (int)uVar24;
      lVar15 = (long)iVar29;
      lVar18 = lVar15 << 0x20;
      lVar20 = lVar16 + lVar15 * 4;
      lVar28 = 0;
      do {
        if (lVar23 <= lVar15 + 1 + lVar28) {
          lVar14 = lVar18 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar14) != '\0') {
            if (pcVar19[lVar14] == '\0') {
LAB_0019129e:
              uVar13 = *(uint *)((long)puVar3 + (lVar18 >> 0x1e));
            }
            else {
              uVar13 = puVar17[lVar14];
            }
            puVar3[lVar14] = uVar13;
          }
          goto LAB_001912a8;
        }
        if (*(char *)(lVar22 + lVar15 + lVar14 + 1 + lVar28) == '\0') {
          iVar29 = iVar29 + (int)lVar28;
          goto LAB_00191241;
        }
        if (*(char *)(lVar10 * lVar27 + lVar15 + lVar14 + 1 + lVar28) == '\0') goto LAB_0019124a;
        *(undefined4 *)(lVar11 + 4 + lVar20 + lVar28 * 4) =
             *(undefined4 *)(lVar12 * lVar27 + lVar15 * 4 + lVar11 + 4 + lVar28 * 4);
        lVar18 = lVar18 + 0x100000000;
        lVar28 = lVar28 + 1;
      } while( true );
    }
    if (*(char *)(lVar14 + lVar22) != '\0') {
      if (*pcVar19 == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar13 = UFPC::length_ + 1;
        *puVar3 = UFPC::length_;
        UFPC::length_ = uVar13;
      }
      else {
        *puVar3 = *puVar17;
      }
    }
LAB_001912a8:
    lVar25 = lVar25 + 1;
    lVar27 = lVar27 + 1;
  } while( true );
LAB_0019124a:
  lVar21 = lVar18 + 0x200000000 >> 0x20;
  if (pcVar19[lVar21] == '\0') {
    lVar15 = lVar15 + lVar28 + 1;
    *(undefined4 *)(lVar20 + lVar11 + 4 + lVar28 * 4) =
         *(undefined4 *)((long)puVar3 + (lVar18 >> 0x1e));
    goto LAB_00191003;
  }
  iVar29 = iVar29 + (int)lVar28;
  uVar13 = UFPC::Merge(*(uint *)((long)puVar3 + (lVar18 >> 0x1e)),puVar17[lVar21]);
  *(uint *)(lVar20 + lVar11 + 4 + lVar28 * 4) = uVar13;
LAB_001910eb:
  uVar24 = (ulong)(iVar29 + 1);
  while( true ) {
    iVar29 = (int)uVar24;
LAB_001910fe:
    lVar15 = (long)iVar29;
    uVar24 = lVar15 + 1;
    cVar6 = *(char *)(lVar2 + 1 + lVar15);
    if (iVar26 <= (int)uVar24) break;
    if (cVar6 != '\0') {
      puVar3[lVar15 + 1] = puVar17[lVar15 + 1];
      goto LAB_00191132;
    }
LAB_00190e33:
    while( true ) {
      lVar18 = (long)(int)uVar24;
      lVar15 = lVar18 << 0x20;
      lVar20 = 0;
      do {
        lVar28 = lVar15;
        lVar21 = lVar28 >> 0x20;
        if (lVar23 <= lVar18 + lVar20 + 1) {
          lVar14 = lVar28 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar14) == '\0') goto LAB_001912a8;
          if (pcVar19[lVar14] == '\0') {
            if (pcVar19[lVar21] == '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar13 = UFPC::length_ + 1;
              puVar3[lVar14] = UFPC::length_;
              UFPC::length_ = uVar13;
              goto LAB_001912a8;
            }
            uVar13 = puVar17[lVar21];
          }
          else {
            uVar13 = puVar17[lVar14];
          }
          puVar3[lVar14] = uVar13;
          goto LAB_001912a8;
        }
        lVar1 = lVar20 + 1;
        pcVar4 = (char *)(lVar22 + lVar18 + lVar14 + 1 + lVar20);
        lVar15 = lVar28 + 0x100000000;
        lVar20 = lVar1;
      } while (*pcVar4 == '\0');
      uVar24 = (uVar24 & 0xffffffff) + lVar1;
      if (*(char *)(lVar1 + lVar10 * lVar27 + lVar18 + lVar14) != '\0') {
        *(undefined4 *)(lVar16 + lVar18 * 4 + lVar11 + lVar1 * 4) =
             *(undefined4 *)(lVar12 * lVar27 + lVar18 * 4 + lVar11 + lVar1 * 4);
        goto LAB_00191132;
      }
      lVar15 = lVar28 + 0x200000000 >> 0x20;
      if (pcVar19[lVar15] != '\0') break;
      lVar15 = lVar18 + lVar1;
      if (pcVar19[lVar21] == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar13 = UFPC::length_ + 1;
        *(uint *)(lVar16 + lVar18 * 4 + lVar11 + lVar1 * 4) = UFPC::length_;
        UFPC::length_ = uVar13;
      }
      else {
        *(uint *)(lVar16 + lVar18 * 4 + lVar11 + lVar1 * 4) = puVar17[lVar21];
      }
LAB_00191003:
      iVar29 = (int)lVar15;
      lVar28 = (long)iVar29;
      lVar18 = lVar15 << 0x20;
      lVar15 = lVar16 + lVar28 * 4;
      lVar20 = lVar15 + lVar11;
      lVar21 = 0;
      while( true ) {
        if (lVar23 <= lVar28 + lVar21 + 1) {
          lVar14 = lVar18 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar14) == '\0') goto LAB_001912a8;
          goto LAB_0019129e;
        }
        if (*(char *)(lVar22 + lVar28 + lVar14 + 1 + lVar21) == '\0') break;
        if (*(char *)(lVar10 * lVar27 + lVar28 + lVar14 + 2 + lVar21) != '\0') {
          iVar29 = iVar29 + (int)lVar21;
          uVar13 = UFPC::Merge(*(uint *)((long)puVar3 + (lVar18 >> 0x1e)),
                               *(uint *)(lVar12 * lVar27 + lVar28 * 4 + lVar11 + 8 + lVar21 * 4));
          *(uint *)(lVar15 + lVar11 + 4 + lVar21 * 4) = uVar13;
          goto LAB_001910eb;
        }
        *(undefined4 *)(lVar20 + 4 + lVar21 * 4) = *(undefined4 *)(lVar20 + lVar21 * 4);
        lVar18 = lVar18 + 0x100000000;
        lVar21 = lVar21 + 1;
      }
      iVar29 = iVar29 + (int)lVar21;
LAB_00191241:
      uVar24 = (ulong)(iVar29 + 1);
    }
    if (pcVar19[lVar21] == '\0') {
      uVar13 = puVar17[lVar15];
    }
    else {
      uVar13 = UFPC::Merge(puVar17[lVar21],puVar17[lVar15]);
    }
    *(uint *)(lVar16 + lVar18 * 4 + lVar11 + lVar1 * 4) = uVar13;
  }
  if (cVar6 != '\0') {
    puVar3[lVar15 + 1] = puVar17[lVar15 + 1];
  }
  goto LAB_001912a8;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }